

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PixelToaster.cpp
# Opt level: O0

Converter * PixelToaster::requestConverter(Format source,Format destination)

{
  Enumeration EVar1;
  Format local_18;
  Format local_14;
  Format destination_local;
  Format source_local;
  
  local_18.enumeration = destination.enumeration;
  local_14.enumeration = source.enumeration;
  EVar1 = Format::operator_cast_to_Enumeration(&local_14);
  if (EVar1 == XBGRFFFF) {
    EVar1 = Format::operator_cast_to_Enumeration(&local_18);
    switch(EVar1) {
    case XRGB8888:
      _destination_local = (Converter_XBGRFFFF_to_XBGRFFFF *)&converter_XBGRFFFF_to_XRGB8888;
      break;
    case XBGR8888:
      _destination_local = (Converter_XBGRFFFF_to_XBGRFFFF *)&converter_XBGRFFFF_to_XBGR8888;
      break;
    case RGB888:
      _destination_local = (Converter_XBGRFFFF_to_XBGRFFFF *)&converter_XBGRFFFF_to_RGB888;
      break;
    case BGR888:
      _destination_local = (Converter_XBGRFFFF_to_XBGRFFFF *)&converter_XBGRFFFF_to_BGR888;
      break;
    case RGB565:
      _destination_local = (Converter_XBGRFFFF_to_XBGRFFFF *)&converter_XBGRFFFF_to_RGB565;
      break;
    case BGR565:
      _destination_local = (Converter_XBGRFFFF_to_XBGRFFFF *)&converter_XBGRFFFF_to_BGR565;
      break;
    case XRGB1555:
      _destination_local = (Converter_XBGRFFFF_to_XBGRFFFF *)&converter_XBGRFFFF_to_XRGB1555;
      break;
    case XBGR1555:
      _destination_local = (Converter_XBGRFFFF_to_XBGRFFFF *)&converter_XBGRFFFF_to_XBGR1555;
      break;
    case XBGRFFFF:
      _destination_local = &converter_XBGRFFFF_to_XBGRFFFF;
      break;
    default:
      _destination_local = (Converter_XBGRFFFF_to_XBGRFFFF *)0x0;
    }
  }
  else {
    EVar1 = Format::operator_cast_to_Enumeration(&local_14);
    if (EVar1 == XRGB8888) {
      EVar1 = Format::operator_cast_to_Enumeration(&local_18);
      switch(EVar1) {
      case XRGB8888:
        _destination_local = (Converter_XBGRFFFF_to_XBGRFFFF *)&converter_XRGB8888_to_XRGB8888;
        break;
      case XBGR8888:
        _destination_local = (Converter_XBGRFFFF_to_XBGRFFFF *)&converter_XRGB8888_to_XBGR8888;
        break;
      case RGB888:
        _destination_local = (Converter_XBGRFFFF_to_XBGRFFFF *)&converter_XRGB8888_to_RGB888;
        break;
      case BGR888:
        _destination_local = (Converter_XBGRFFFF_to_XBGRFFFF *)&converter_XRGB8888_to_BGR888;
        break;
      case RGB565:
        _destination_local = (Converter_XBGRFFFF_to_XBGRFFFF *)&converter_XRGB8888_to_RGB565;
        break;
      case BGR565:
        _destination_local = (Converter_XBGRFFFF_to_XBGRFFFF *)&converter_XRGB8888_to_BGR565;
        break;
      case XRGB1555:
        _destination_local = (Converter_XBGRFFFF_to_XBGRFFFF *)&converter_XRGB8888_to_XRGB1555;
        break;
      case XBGR1555:
        _destination_local = (Converter_XBGRFFFF_to_XBGRFFFF *)&converter_XRGB8888_to_XBGR1555;
        break;
      case XBGRFFFF:
        _destination_local = (Converter_XBGRFFFF_to_XBGRFFFF *)&converter_XRGB8888_to_XBGRFFFF;
        break;
      default:
        _destination_local = (Converter_XBGRFFFF_to_XBGRFFFF *)0x0;
      }
    }
    else {
      _destination_local = (Converter_XBGRFFFF_to_XBGRFFFF *)0x0;
    }
  }
  return (Converter *)_destination_local;
}

Assistant:

PIXELTOASTER_API PixelToaster::Converter* PixelToaster::requestConverter(PixelToaster::Format source, PixelToaster::Format destination)
{
    if (source == Format::XBGRFFFF)
    {
        switch (destination)
        {
            case Format::XBGRFFFF: return &converter_XBGRFFFF_to_XBGRFFFF;
            case Format::XRGB8888: return &converter_XBGRFFFF_to_XRGB8888;
            case Format::XBGR8888: return &converter_XBGRFFFF_to_XBGR8888;
            case Format::RGB888: return &converter_XBGRFFFF_to_RGB888;
            case Format::BGR888: return &converter_XBGRFFFF_to_BGR888;
            case Format::RGB565: return &converter_XBGRFFFF_to_RGB565;
            case Format::BGR565: return &converter_XBGRFFFF_to_BGR565;
            case Format::XRGB1555: return &converter_XBGRFFFF_to_XRGB1555;
            case Format::XBGR1555: return &converter_XBGRFFFF_to_XBGR1555;

            default:
                return nullptr;
        }
    }
    else if (source == Format::XRGB8888)
    {
        switch (destination)
        {
            case Format::XBGRFFFF: return &converter_XRGB8888_to_XBGRFFFF;
            case Format::XRGB8888: return &converter_XRGB8888_to_XRGB8888;
            case Format::XBGR8888: return &converter_XRGB8888_to_XBGR8888;
            case Format::RGB888: return &converter_XRGB8888_to_RGB888;
            case Format::BGR888: return &converter_XRGB8888_to_BGR888;
            case Format::RGB565: return &converter_XRGB8888_to_RGB565;
            case Format::BGR565: return &converter_XRGB8888_to_BGR565;
            case Format::XRGB1555: return &converter_XRGB8888_to_XRGB1555;
            case Format::XBGR1555: return &converter_XRGB8888_to_XBGR1555;

            default:
                return nullptr;
        }
    }

    return nullptr;
}